

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

void cleanup_object(void)

{
  object_kind *poVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0x260;
  for (uVar2 = 0; poVar1 = k_info, uVar2 < z_info->k_max; uVar2 = uVar2 + 1) {
    string_free(*(char **)((long)k_info + lVar3 + -0x260));
    string_free(*(char **)((long)poVar1 + lVar3 + -600));
    if (uVar2 < z_info->ordinary_kind_max) {
      string_free(*(char **)((long)poVar1 + lVar3 + -8));
    }
    string_free(*(char **)(poVar1->flags + lVar3 + -0x80));
    mem_free(*(void **)((long)poVar1 + lVar3 + -0x50));
    mem_free(*(void **)((long)poVar1 + lVar3 + -0x48));
    mem_free(*(void **)((long)poVar1 + lVar3 + -0x40));
    if (uVar2 < z_info->ordinary_kind_max) {
      free_effect(*(effect **)((long)poVar1 + lVar3 + -0x18));
    }
    lVar3 = lVar3 + 0x2c0;
  }
  mem_free(k_info);
  return;
}

Assistant:

static void cleanup_object(void)
{
	int idx;
	for (idx = 0; idx < z_info->k_max; idx++) {
		struct object_kind *kind = &k_info[idx];
		string_free(kind->name);
		string_free(kind->text);
		if (idx < z_info->ordinary_kind_max) {
			string_free(kind->effect_msg);
		}
		string_free(kind->vis_msg);
		mem_free(kind->brands);
		mem_free(kind->slays);
		mem_free(kind->curses);
		if (idx < z_info->ordinary_kind_max) {
			free_effect(kind->effect);
		}
	}
	mem_free(k_info);
}